

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

NamedMDNode * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::NamedMDNode,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>&,std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>>
          (LLVMContext *this,Module **u,
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_1,
          vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *u_2)

{
  Module *module;
  vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> local_70;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_58;
  NamedMDNode *local_38;
  NamedMDNode *t;
  NamedMDNode *mem;
  vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *u_local_2;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_local_1;
  Module **u_local;
  LLVMContext *this_local;
  
  mem = (NamedMDNode *)u_2;
  u_local_2 = (vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)u_1;
  u_local_1 = (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)u
  ;
  u_local = (Module **)this;
  local_38 = (NamedMDNode *)allocate(this,0x48,8);
  t = local_38;
  if (local_38 == (NamedMDNode *)0x0) {
    std::terminate();
  }
  module = (Module *)(u_local_1->_M_dataplus)._M_p;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_58,
               (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               u_local_2);
  std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::vector
            (&local_70,
             (vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)mem);
  NamedMDNode::NamedMDNode(local_38,module,&local_58,&local_70);
  std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::~vector
            (&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_58);
  append_typed_destructor<LLVMBC::NamedMDNode>(this,local_38);
  return local_38;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}